

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
          (Function_Caller_Ret<chaiscript::Boxed_Value,_false> *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params
          ,Type_Conversions_State *t_conversions)

{
  _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Result_Type RVar2;
  Boxed_Value BVar3;
  Type_Conversions conv;
  Type_Conversions_State state;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  _Stack_b0;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  _Stack_80;
  undefined8 uStack_50;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_48;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_40;
  Type_Conversions_State local_38;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
              ((dispatch *)local_d8,t_funcs,params,t_conversions);
    RVar2 = boxed_cast<chaiscript::Boxed_Value>
                      ((chaiscript *)this,(Boxed_Value *)local_d8,t_conversions);
    _Var1._M_pi = RVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (uStack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_d0);
      _Var1._M_pi = extraout_RDX;
    }
    goto LAB_001e3d5b;
  }
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_b0._M_impl.super__Rb_tree_header._M_header;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8 = 0;
  _Stack_b0._M_impl._0_8_ = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = (undefined1  [8])0x0;
  uStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_80._M_impl.super__Rb_tree_header._M_header;
  _Stack_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_80._M_impl._0_8_ = 0;
  _Stack_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_80._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_50 = 0;
  _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_80._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_80._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48.m_key = (Type_Conversions *)local_d8;
  local_40.m_key = (Type_Conversions *)local_d8;
  this_00 = (_Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)chaiscript::detail::threading::
               Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::t();
  local_38.m_saves._M_data =
       std::__detail::
       _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::operator[](this_00,&local_40.m_key);
  local_38.m_conversions._M_data = (Type_Conversions *)local_d8;
  dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
            ((dispatch *)&local_e8,t_funcs,params,&local_38);
  *(undefined8 *)this = local_e8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_e0;
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_e0->_M_use_count = local_e0->_M_use_count + 1;
      UNLOCK();
      if (local_e0 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001e3d37;
    }
    else {
      local_e0->_M_use_count = local_e0->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
LAB_001e3d37:
  chaiscript::detail::threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::
  ~Thread_Storage(&local_40);
  chaiscript::detail::threading::
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  ::~Thread_Storage(&local_48);
  std::
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  ::~_Rb_tree(&_Stack_80);
  std::
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ::~_Rb_tree(&_Stack_b0);
  _Var1._M_pi = extraout_RDX_00;
LAB_001e3d5b:
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ret call(const std::vector<Const_Proxy_Function> &t_funcs, 
              const std::vector<Boxed_Value> &params, const Type_Conversions_State *t_conversions)
          {
            if (t_conversions) {
              return boxed_cast<Ret>(dispatch::dispatch(t_funcs, params, *t_conversions), t_conversions);
            } else {
              Type_Conversions conv;
              Type_Conversions_State state(conv, conv.conversion_saves());
              return boxed_cast<Ret>(dispatch::dispatch(t_funcs, params, state), t_conversions);
            }
          }